

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandCec(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  int fIgnoreNames;
  int fPartition;
  int nInsLimit;
  int nConfLimit;
  int nPartSize;
  int nSeconds;
  int fVerbose;
  int fSat;
  int c;
  int nArgcNew;
  char **pArgvNew;
  int fDelete2;
  int fDelete1;
  Abc_Ntk_t *pNtk2;
  Abc_Ntk_t *pNtk1;
  Abc_Ntk_t *pNtk;
  char Buffer [16];
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Buffer._8_8_ = argv;
  pNtk1 = Abc_FrameReadNtk(pAbc);
  bVar3 = false;
  nPartSize = 0;
  nConfLimit = 0x14;
  nInsLimit = 0;
  fPartition = 10000;
  fIgnoreNames = 0;
  bVar2 = false;
  bVar1 = false;
  Extra_UtilGetoptReset();
LAB_0028e712:
  do {
    iVar4 = Extra_UtilGetopt(argc,(char **)Buffer._8_8_,"TCIPpsnvh");
    if (iVar4 == -1) {
      if ((pNtk1 != (Abc_Ntk_t *)0x0) && (pNtk1->vPhases != (Vec_Int_t *)0x0)) {
        Abc_Print(-1,"Cannot compare networks with phases defined.\n");
        return 1;
      }
      iVar4 = Abc_NtkPrepareTwoNtks
                        (_stdout,pNtk1,(char **)(Buffer._8_8_ + (long)globalUtilOptind * 8),
                         argc - globalUtilOptind,&pNtk2,(Abc_Ntk_t **)&fDelete2,
                         (int *)((long)&pArgvNew + 4),(int *)&pArgvNew,1);
      if (iVar4 == 0) {
        return 1;
      }
      if (bVar1) {
        if (pArgvNew._4_4_ == 0) {
          pNtk2 = Abc_NtkStrash(pNtk2,0,1,0);
          pArgvNew._4_4_ = 1;
        }
        if ((int)pArgvNew == 0) {
          _fDelete2 = Abc_NtkStrash(_fDelete2,0,1,0);
          pArgvNew._0_4_ = 1;
        }
        Abc_NtkShortNames(pNtk2);
        Abc_NtkShortNames(_fDelete2);
      }
      if (bVar2) {
        Abc_NtkCecFraigPartAuto(pNtk2,_fDelete2,nConfLimit,nPartSize);
      }
      else if (nInsLimit == 0) {
        if (bVar3) {
          Abc_NtkCecSat(pNtk2,_fDelete2,fPartition,fIgnoreNames);
        }
        else {
          Abc_NtkCecFraig(pNtk2,_fDelete2,nConfLimit,nPartSize);
        }
      }
      else {
        Abc_NtkCecFraigPart(pNtk2,_fDelete2,nConfLimit,nInsLimit,nPartSize);
      }
      if (pArgvNew._4_4_ != 0) {
        Abc_NtkDelete(pNtk2);
      }
      if ((int)pArgvNew != 0) {
        Abc_NtkDelete(_fDelete2);
      }
      return 0;
    }
    switch(iVar4) {
    case 0x43:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
        goto LAB_0028eac3;
      }
      fPartition = atoi(*(char **)(Buffer._8_8_ + (long)globalUtilOptind * 8));
      iVar4 = fPartition;
      break;
    default:
      goto LAB_0028eac3;
    case 0x49:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-I\" should be followed by an integer.\n");
        goto LAB_0028eac3;
      }
      fIgnoreNames = atoi(*(char **)(Buffer._8_8_ + (long)globalUtilOptind * 8));
      iVar4 = fIgnoreNames;
      break;
    case 0x50:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-P\" should be followed by an integer.\n");
        goto LAB_0028eac3;
      }
      nInsLimit = atoi(*(char **)(Buffer._8_8_ + (long)globalUtilOptind * 8));
      iVar4 = nInsLimit;
      break;
    case 0x54:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-T\" should be followed by an integer.\n");
        goto LAB_0028eac3;
      }
      nConfLimit = atoi(*(char **)(Buffer._8_8_ + (long)globalUtilOptind * 8));
      iVar4 = nConfLimit;
      break;
    case 0x6e:
      bVar1 = (bool)(bVar1 ^ 1);
      goto LAB_0028e712;
    case 0x70:
      bVar2 = (bool)(bVar2 ^ 1);
      goto LAB_0028e712;
    case 0x73:
      bVar3 = (bool)(bVar3 ^ 1);
      goto LAB_0028e712;
    case 0x76:
      nPartSize = nPartSize ^ 1;
      goto LAB_0028e712;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar4 < 0) {
LAB_0028eac3:
      if (nInsLimit == 0) {
        strcpy((char *)&pNtk,"unused");
      }
      else {
        sprintf((char *)&pNtk,"%d",(ulong)(uint)nInsLimit);
      }
      Abc_Print(-2,"usage: cec [-T num] [-C num] [-I num] [-P num] [-psnvh] <file1> <file2>\n");
      Abc_Print(-2,"\t         performs combinational equivalence checking\n");
      Abc_Print(-2,"\t-T num : approximate runtime limit in seconds [default = %d]\n",
                (ulong)(uint)nConfLimit);
      Abc_Print(-2,"\t-C num : limit on the number of conflicts [default = %d]\n",
                (ulong)(uint)fPartition);
      Abc_Print(-2,"\t-I num : limit on the number of clause inspections [default = %d]\n",
                (ulong)(uint)fIgnoreNames);
      Abc_Print(-2,"\t-P num : partition size for multi-output networks [default = %s]\n",&pNtk);
      pcVar5 = "no";
      if (bVar2) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-p     : toggle automatic partitioning [default = %s]\n",pcVar5);
      pcVar5 = "FRAIG + SAT";
      if (bVar3) {
        pcVar5 = "SAT only";
      }
      Abc_Print(-2,"\t-s     : toggle \"SAT only\" and \"FRAIG + SAT\" [default = %s]\n",pcVar5);
      pcVar5 = "by name";
      if (bVar1) {
        pcVar5 = "by order";
      }
      Abc_Print(-2,
                "\t-n     : toggle how CIs/COs are matched (by name or by order) [default = %s]\n",
                pcVar5);
      pcVar5 = "no";
      if (nPartSize != 0) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar5);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      Abc_Print(-2,"\tfile1  : (optional) the file with the first network\n");
      Abc_Print(-2,"\tfile2  : (optional) the file with the second network\n");
      Abc_Print(-2,"\t         if no files are given, uses the current network and its spec\n");
      Abc_Print(-2,"\t         if one file is given, uses the current network and the file\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandCec( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    char Buffer[16];
    Abc_Ntk_t * pNtk, * pNtk1, * pNtk2;
    int fDelete1, fDelete2;
    char ** pArgvNew;
    int nArgcNew;
    int c;
    int fSat;
    int fVerbose;
    int nSeconds;
    int nPartSize;
    int nConfLimit;
    int nInsLimit;
    int fPartition;
    int fIgnoreNames;

    extern void Abc_NtkCecSat( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nConfLimit, int nInsLimit );
    extern void Abc_NtkCecFraig( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nSeconds, int fVerbose );
    extern void Abc_NtkCecFraigPart( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nSeconds, int nPartSize, int fVerbose );
    extern void Abc_NtkCecFraigPartAuto( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nSeconds, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    fSat     =  0;
    fVerbose =  0;
    nSeconds = 20;
    nPartSize  = 0;
    nConfLimit = 10000;
    nInsLimit  = 0;
    fPartition = 0;
    fIgnoreNames = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "TCIPpsnvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            nSeconds = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nSeconds < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConfLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConfLimit < 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            nInsLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nInsLimit < 0 )
                goto usage;
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            nPartSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nPartSize < 0 )
                goto usage;
            break;
        case 'p':
            fPartition ^= 1;
            break;
        case 's':
            fSat ^= 1;
            break;
        case 'n':
            fIgnoreNames ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        default:
            goto usage;
        }
    }

    if ( pNtk && pNtk->vPhases != NULL )
    {
        Abc_Print( -1, "Cannot compare networks with phases defined.\n" );
        return 1;
    }

    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( !Abc_NtkPrepareTwoNtks( stdout, pNtk, pArgvNew, nArgcNew, &pNtk1, &pNtk2, &fDelete1, &fDelete2, 1 ) )
        return 1;

    if ( fIgnoreNames )
    {
        if ( !fDelete1 )
        {
            pNtk1 = Abc_NtkStrash( pNtk1, 0, 1, 0 );
            fDelete1 = 1;
        }
        if ( !fDelete2 )
        {
            pNtk2 = Abc_NtkStrash( pNtk2, 0, 1, 0 );
            fDelete2 = 1;
        }
        Abc_NtkShortNames( pNtk1 );
        Abc_NtkShortNames( pNtk2 );
    }

    // perform equivalence checking
    if ( fPartition )
        Abc_NtkCecFraigPartAuto( pNtk1, pNtk2, nSeconds, fVerbose );
    else if ( nPartSize )
        Abc_NtkCecFraigPart( pNtk1, pNtk2, nSeconds, nPartSize, fVerbose );
    else if ( fSat )
        Abc_NtkCecSat( pNtk1, pNtk2, nConfLimit, nInsLimit );
    else
        Abc_NtkCecFraig( pNtk1, pNtk2, nSeconds, fVerbose );

    if ( fDelete1 ) Abc_NtkDelete( pNtk1 );
    if ( fDelete2 ) Abc_NtkDelete( pNtk2 );
    return 0;

usage:
    if ( nPartSize == 0 )
        strcpy( Buffer, "unused" );
    else
        sprintf(Buffer, "%d", nPartSize );
    Abc_Print( -2, "usage: cec [-T num] [-C num] [-I num] [-P num] [-psnvh] <file1> <file2>\n" );
    Abc_Print( -2, "\t         performs combinational equivalence checking\n" );
    Abc_Print( -2, "\t-T num : approximate runtime limit in seconds [default = %d]\n", nSeconds );
    Abc_Print( -2, "\t-C num : limit on the number of conflicts [default = %d]\n",    nConfLimit );
    Abc_Print( -2, "\t-I num : limit on the number of clause inspections [default = %d]\n", nInsLimit );
    Abc_Print( -2, "\t-P num : partition size for multi-output networks [default = %s]\n", Buffer );
    Abc_Print( -2, "\t-p     : toggle automatic partitioning [default = %s]\n", fPartition? "yes": "no" );
    Abc_Print( -2, "\t-s     : toggle \"SAT only\" and \"FRAIG + SAT\" [default = %s]\n", fSat? "SAT only": "FRAIG + SAT" );
    Abc_Print( -2, "\t-n     : toggle how CIs/COs are matched (by name or by order) [default = %s]\n", fIgnoreNames? "by order": "by name" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\tfile1  : (optional) the file with the first network\n");
    Abc_Print( -2, "\tfile2  : (optional) the file with the second network\n");
    Abc_Print( -2, "\t         if no files are given, uses the current network and its spec\n");
    Abc_Print( -2, "\t         if one file is given, uses the current network and the file\n");
    return 1;
}